

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_buffer_compressor_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::
ZLIBBufferCompressorTest_decompression_output_buffer_and_deflating_buffer_can_be_reused_Test::
TestBody(ZLIBBufferCompressorTest_decompression_output_buffer_and_deflating_buffer_can_be_reused_Test
         *this)

{
  bool bVar1;
  ulong uVar2;
  pointer pcVar3;
  char *pcVar4;
  AssertHelper local_3c8;
  Message local_3c0;
  allocator local_3b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  undefined1 local_390 [8];
  AssertionResult gtest_ar_1;
  unique_ptr<const_char,_std::default_delete<const_char>_> decompressed_bytes2;
  ByteBuffer decompressed2;
  ZLIBBufferInflator local_348 [8];
  ZLIBBufferInflator decompressor2;
  ByteBuffer local_2d0 [8];
  ByteBuffer compressed2;
  ZLIBBufferCompressor local_2a0 [8];
  ZLIBBufferCompressor compressor2;
  AssertHelper local_1f0;
  Message local_1e8;
  allocator local_1d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar;
  unique_ptr<const_char,_std::default_delete<const_char>_> decompressed_bytes1;
  ByteBuffer decompressed1;
  ZLIBBufferInflator local_170 [8];
  ZLIBBufferInflator decompressor1;
  ByteBuffer local_f8 [8];
  ByteBuffer compressed1;
  ZLIBBufferCompressor local_b8 [8];
  ZLIBBufferCompressor compressor1;
  ZLIBBufferCompressorTest_decompression_output_buffer_and_deflating_buffer_can_be_reused_Test
  *this_local;
  
  bidfx_public_api::tools::ZLIBBufferCompressor::ZLIBBufferCompressor(local_b8,5);
  uVar2 = std::__cxx11::string::operator[]
                    ((ulong)&(this->super_ZLIBBufferCompressorTest).SMALL_TEXT);
  std::__cxx11::string::size();
  bidfx_public_api::tools::ZLIBBufferCompressor::Compress((uchar *)local_b8,uVar2,0);
  bidfx_public_api::tools::ZLIBBufferCompressor::GetCompressed();
  bidfx_public_api::tools::ZLIBBufferInflator::ZLIBBufferInflator(local_170);
  bidfx_public_api::tools::ZLIBBufferInflator::Inflate((ByteBuffer *)&decompressed_bytes1);
  pcVar3 = (pointer)bidfx_public_api::tools::ByteBuffer::ToArray();
  std::unique_ptr<char_const,std::default_delete<char_const>>::
  unique_ptr<std::default_delete<char_const>,void>
            ((unique_ptr<char_const,std::default_delete<char_const>> *)&gtest_ar.message_,pcVar3);
  pcVar3 = std::unique_ptr<const_char,_std::default_delete<const_char>_>::get
                     ((unique_ptr<const_char,_std::default_delete<const_char>_> *)&gtest_ar.message_
                     );
  uVar2 = bidfx_public_api::tools::ByteBuffer::ReadableBytes();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d8,pcVar3,uVar2,&local_1d9);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_1b8,"SMALL_TEXT",
             "std::string(decompressed_bytes1.get(), decompressed1.ReadableBytes())",
             &(this->super_ZLIBBufferCompressorTest).SMALL_TEXT,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/zlib_buffer_compressor_test.cpp"
               ,0xfe,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  if (bVar1) {
    bidfx_public_api::tools::ZLIBBufferCompressor::ZLIBBufferCompressor(local_2a0,5);
    uVar2 = std::__cxx11::string::operator[]
                      ((ulong)&(this->super_ZLIBBufferCompressorTest).SMALL_TEXT);
    std::__cxx11::string::size();
    bidfx_public_api::tools::ZLIBBufferCompressor::Compress((uchar *)local_2a0,uVar2,0);
    bidfx_public_api::tools::ZLIBBufferCompressor::GetCompressed();
    bidfx_public_api::tools::ZLIBBufferInflator::ZLIBBufferInflator(local_348);
    bidfx_public_api::tools::ZLIBBufferInflator::Inflate((ByteBuffer *)&decompressed_bytes2);
    pcVar3 = (pointer)bidfx_public_api::tools::ByteBuffer::ToArray();
    std::unique_ptr<char_const,std::default_delete<char_const>>::
    unique_ptr<std::default_delete<char_const>,void>
              ((unique_ptr<char_const,std::default_delete<char_const>> *)&gtest_ar_1.message_,pcVar3
              );
    pcVar3 = std::unique_ptr<const_char,_std::default_delete<const_char>_>::get
                       ((unique_ptr<const_char,_std::default_delete<const_char>_> *)
                        &gtest_ar_1.message_);
    uVar2 = bidfx_public_api::tools::ByteBuffer::ReadableBytes();
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3b0,pcVar3,uVar2,&local_3b1);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((EqHelper<false> *)local_390,"SMALL_TEXT",
               "std::string(decompressed_bytes2.get(), decompressed2.ReadableBytes())",
               &(this->super_ZLIBBufferCompressorTest).SMALL_TEXT,&local_3b0);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
    if (!bVar1) {
      testing::Message::Message(&local_3c0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_390);
      testing::internal::AssertHelper::AssertHelper
                (&local_3c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/zlib_buffer_compressor_test.cpp"
                 ,0x107,pcVar4);
      testing::internal::AssertHelper::operator=(&local_3c8,&local_3c0);
      testing::internal::AssertHelper::~AssertHelper(&local_3c8);
      testing::Message::~Message(&local_3c0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
    std::unique_ptr<const_char,_std::default_delete<const_char>_>::~unique_ptr
              ((unique_ptr<const_char,_std::default_delete<const_char>_> *)&gtest_ar_1.message_);
    bidfx_public_api::tools::ByteBuffer::~ByteBuffer((ByteBuffer *)&decompressed_bytes2);
    bidfx_public_api::tools::ZLIBBufferInflator::~ZLIBBufferInflator(local_348);
    bidfx_public_api::tools::ByteBuffer::~ByteBuffer(local_2d0);
    bidfx_public_api::tools::ZLIBBufferCompressor::~ZLIBBufferCompressor(local_2a0);
  }
  std::unique_ptr<const_char,_std::default_delete<const_char>_>::~unique_ptr
            ((unique_ptr<const_char,_std::default_delete<const_char>_> *)&gtest_ar.message_);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer((ByteBuffer *)&decompressed_bytes1);
  bidfx_public_api::tools::ZLIBBufferInflator::~ZLIBBufferInflator(local_170);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(local_f8);
  bidfx_public_api::tools::ZLIBBufferCompressor::~ZLIBBufferCompressor(local_b8);
  return;
}

Assistant:

TEST_F(ZLIBBufferCompressorTest, decompression_output_buffer_and_deflating_buffer_can_be_reused)
{
    ZLIBBufferCompressor compressor1 = ZLIBBufferCompressor(5);
    compressor1.Compress((unsigned char*) &SMALL_TEXT[0], 0, SMALL_TEXT.size());
    ByteBuffer compressed1 = compressor1.GetCompressed();

    ZLIBBufferInflator decompressor1;
    ByteBuffer decompressed1 = decompressor1.Inflate(compressed1);
    std::unique_ptr<const char> decompressed_bytes1 = std::unique_ptr<const char>((const char*) decompressed1.ToArray());
    ASSERT_EQ(SMALL_TEXT, std::string(decompressed_bytes1.get(), decompressed1.ReadableBytes()));

    ZLIBBufferCompressor compressor2 = ZLIBBufferCompressor(5);
    compressor2.Compress((unsigned char*) &SMALL_TEXT[0], 0, SMALL_TEXT.size());
    ByteBuffer compressed2 = compressor2.GetCompressed();

    ZLIBBufferInflator decompressor2;
    ByteBuffer decompressed2 = decompressor2.Inflate(compressed2);
    std::unique_ptr<const char> decompressed_bytes2 = std::unique_ptr<const char>((const char*) decompressed2.ToArray());
    EXPECT_EQ(SMALL_TEXT, std::string(decompressed_bytes2.get(), decompressed2.ReadableBytes()));
}